

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float **ppfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  RTCFilterFunctionN p_Var7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined4 uVar10;
  undefined1 (*pauVar11) [16];
  long lVar12;
  byte bVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  undefined1 (*pauVar17) [16];
  ulong uVar18;
  long lVar19;
  undefined1 (*pauVar20) [16];
  Scene *pSVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  undefined1 (*pauVar26) [16];
  ulong uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  float fVar51;
  float fVar52;
  float fVar53;
  undefined1 auVar50 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [64];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  uint uVar61;
  uint uVar62;
  uint uVar63;
  undefined1 auVar60 [64];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [64];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [64];
  vbool<4> valid;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vfloat<8> tNear;
  HitK<4> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_26c0 [16];
  Scene *local_26a8;
  undefined1 local_26a0 [16];
  undefined1 local_2690 [16];
  Geometry *local_2678;
  ulong local_2670;
  long local_2668;
  undefined1 (*local_2660) [16];
  long local_2658;
  ulong local_2650;
  ulong local_2648;
  RTCFilterFunctionNArguments local_2640;
  undefined8 local_2610;
  undefined8 uStack_2608;
  undefined1 local_2600 [32];
  undefined1 local_25e0 [16];
  undefined1 local_25d0 [16];
  undefined1 local_25b0 [16];
  float local_25a0 [4];
  float local_2590 [4];
  undefined1 local_2580 [16];
  undefined1 local_2570 [16];
  undefined1 local_2560 [16];
  undefined1 local_2550 [2] [16];
  undefined1 local_2530 [16];
  undefined8 local_2520;
  undefined8 uStack_2518;
  undefined4 local_2510;
  undefined4 uStack_250c;
  undefined4 uStack_2508;
  undefined4 uStack_2504;
  undefined1 local_2500 [16];
  undefined1 local_24f0 [16];
  undefined1 local_24e0 [16];
  float local_24d0;
  float fStack_24cc;
  float fStack_24c8;
  float fStack_24c4;
  undefined1 local_24c0 [16];
  undefined1 local_24b0 [16];
  uint local_24a0;
  uint uStack_249c;
  uint uStack_2498;
  uint uStack_2494;
  uint uStack_2490;
  uint uStack_248c;
  uint uStack_2488;
  uint uStack_2484;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  pauVar11 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  fVar46 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar78 = ZEXT3264(CONCAT428(fVar46,CONCAT424(fVar46,CONCAT420(fVar46,CONCAT416(fVar46,CONCAT412(
                                                  fVar46,CONCAT48(fVar46,CONCAT44(fVar46,fVar46)))))
                                               )));
  fVar51 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_23c0._4_4_ = fVar51;
  local_23c0._0_4_ = fVar51;
  local_23c0._8_4_ = fVar51;
  local_23c0._12_4_ = fVar51;
  local_23c0._16_4_ = fVar51;
  local_23c0._20_4_ = fVar51;
  local_23c0._24_4_ = fVar51;
  local_23c0._28_4_ = fVar51;
  auVar45 = ZEXT3264(local_23c0);
  fVar52 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_23e0._4_4_ = fVar52;
  local_23e0._0_4_ = fVar52;
  local_23e0._8_4_ = fVar52;
  local_23e0._12_4_ = fVar52;
  local_23e0._16_4_ = fVar52;
  local_23e0._20_4_ = fVar52;
  local_23e0._24_4_ = fVar52;
  local_23e0._28_4_ = fVar52;
  auVar50 = ZEXT3264(local_23e0);
  fVar46 = fVar46 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar51 = fVar51 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar52 = fVar52 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_2648 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_2650 = uVar23 ^ 0x20;
  uVar27 = local_2648 ^ 0x20;
  iVar14 = (tray->tfar).field_0.i[k];
  auVar31 = ZEXT3264(CONCAT428(iVar14,CONCAT424(iVar14,CONCAT420(iVar14,CONCAT416(iVar14,CONCAT412(
                                                  iVar14,CONCAT48(iVar14,CONCAT44(iVar14,iVar14)))))
                                               )));
  local_2400._0_8_ = CONCAT44(fVar46,fVar46) ^ 0x8000000080000000;
  local_2400._8_4_ = -fVar46;
  local_2400._12_4_ = -fVar46;
  local_2400._16_4_ = -fVar46;
  local_2400._20_4_ = -fVar46;
  local_2400._24_4_ = -fVar46;
  local_2400._28_4_ = -fVar46;
  auVar56 = ZEXT3264(local_2400);
  local_2420._0_8_ = CONCAT44(fVar51,fVar51) ^ 0x8000000080000000;
  local_2420._8_4_ = -fVar51;
  local_2420._12_4_ = -fVar51;
  local_2420._16_4_ = -fVar51;
  local_2420._20_4_ = -fVar51;
  local_2420._24_4_ = -fVar51;
  local_2420._28_4_ = -fVar51;
  auVar60 = ZEXT3264(local_2420);
  local_2440._0_8_ = CONCAT44(fVar52,fVar52) ^ 0x8000000080000000;
  local_2440._8_4_ = -fVar52;
  local_2440._12_4_ = -fVar52;
  local_2440._16_4_ = -fVar52;
  local_2440._20_4_ = -fVar52;
  local_2440._24_4_ = -fVar52;
  local_2440._28_4_ = -fVar52;
  auVar66 = ZEXT3264(local_2440);
  iVar14 = (tray->tnear).field_0.i[k];
  local_2460._4_4_ = iVar14;
  local_2460._0_4_ = iVar14;
  local_2460._8_4_ = iVar14;
  local_2460._12_4_ = iVar14;
  local_2460._16_4_ = iVar14;
  local_2460._20_4_ = iVar14;
  local_2460._24_4_ = iVar14;
  local_2460._28_4_ = iVar14;
  auVar69 = ZEXT3264(local_2460);
  local_2660 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
LAB_005c2581:
  do {
    pauVar26 = pauVar11 + -1;
    pauVar11 = pauVar11 + -1;
    if (*(float *)(*pauVar26 + 8) <= *(float *)(ray + k * 4 + 0x80)) {
      uVar18 = *(ulong *)*pauVar11;
      while ((uVar18 & 8) == 0) {
        auVar55 = auVar56._0_32_;
        auVar32 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar18 + 0x40 + uVar23),auVar55,
                                  auVar78._0_32_);
        auVar44 = auVar45._0_32_;
        auVar59 = auVar60._0_32_;
        auVar38 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar18 + 0x40 + local_2648),auVar59,auVar44
                                 );
        auVar8 = vpmaxsd_avx2(ZEXT1632(auVar32),ZEXT1632(auVar38));
        auVar49 = auVar50._0_32_;
        auVar65 = auVar66._0_32_;
        auVar32 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar18 + 0x40 + uVar25),auVar65,auVar49);
        auVar9 = vpmaxsd_avx2(ZEXT1632(auVar32),auVar69._0_32_);
        local_2600 = vpmaxsd_avx2(auVar8,auVar9);
        auVar32 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar18 + 0x40 + local_2650),auVar55,
                                  auVar78._0_32_);
        auVar38 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar18 + 0x40 + uVar27),auVar59,auVar44);
        auVar8 = vpminsd_avx2(ZEXT1632(auVar32),ZEXT1632(auVar38));
        auVar32 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar18 + 0x40 + (uVar25 ^ 0x20)),auVar65,
                                  auVar49);
        auVar9 = vpminsd_avx2(ZEXT1632(auVar32),auVar31._0_32_);
        auVar8 = vpminsd_avx2(auVar8,auVar9);
        auVar8 = vpcmpgtd_avx2(local_2600,auVar8);
        iVar14 = vmovmskps_avx(auVar8);
        if (iVar14 == 0xff) {
          if (pauVar11 == (undefined1 (*) [16])&local_23a0) {
            return;
          }
          goto LAB_005c2581;
        }
        bVar13 = ~(byte)iVar14;
        uVar24 = uVar18 & 0xfffffffffffffff0;
        lVar12 = 0;
        for (uVar18 = (ulong)bVar13; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
          lVar12 = lVar12 + 1;
        }
        uVar18 = *(ulong *)(uVar24 + lVar12 * 8);
        uVar15 = bVar13 - 1 & (uint)bVar13;
        uVar16 = (ulong)uVar15;
        if (uVar15 != 0) {
          uVar61 = *(uint *)(local_2600 + lVar12 * 4);
          lVar12 = 0;
          for (; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
            lVar12 = lVar12 + 1;
          }
          uVar15 = uVar15 - 1 & uVar15;
          uVar22 = (ulong)uVar15;
          uVar16 = *(ulong *)(uVar24 + lVar12 * 8);
          uVar62 = *(uint *)(local_2600 + lVar12 * 4);
          if (uVar15 == 0) {
            if (uVar61 < uVar62) {
              *(ulong *)*pauVar11 = uVar16;
              *(uint *)(*pauVar11 + 8) = uVar62;
              pauVar11 = pauVar11 + 1;
            }
            else {
              *(ulong *)*pauVar11 = uVar18;
              *(uint *)(*pauVar11 + 8) = uVar61;
              pauVar11 = pauVar11 + 1;
              uVar18 = uVar16;
            }
          }
          else {
            auVar32._8_8_ = 0;
            auVar32._0_8_ = uVar18;
            auVar32 = vpunpcklqdq_avx(auVar32,ZEXT416(uVar61));
            auVar38._8_8_ = 0;
            auVar38._0_8_ = uVar16;
            auVar38 = vpunpcklqdq_avx(auVar38,ZEXT416(uVar62));
            lVar12 = 0;
            for (; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
              lVar12 = lVar12 + 1;
            }
            uVar15 = uVar15 - 1 & uVar15;
            uVar18 = (ulong)uVar15;
            auVar40._8_8_ = 0;
            auVar40._0_8_ = *(ulong *)(uVar24 + lVar12 * 8);
            auVar33 = vpunpcklqdq_avx(auVar40,ZEXT416(*(uint *)(local_2600 + lVar12 * 4)));
            auVar40 = vpcmpgtd_avx(auVar38,auVar32);
            if (uVar15 == 0) {
              auVar41 = vpshufd_avx(auVar40,0xaa);
              auVar40 = vblendvps_avx(auVar38,auVar32,auVar41);
              auVar32 = vblendvps_avx(auVar32,auVar38,auVar41);
              auVar38 = vpcmpgtd_avx(auVar33,auVar40);
              auVar41 = vpshufd_avx(auVar38,0xaa);
              auVar38 = vblendvps_avx(auVar33,auVar40,auVar41);
              auVar40 = vblendvps_avx(auVar40,auVar33,auVar41);
              auVar33 = vpcmpgtd_avx(auVar40,auVar32);
              auVar41 = vpshufd_avx(auVar33,0xaa);
              auVar33 = vblendvps_avx(auVar40,auVar32,auVar41);
              auVar32 = vblendvps_avx(auVar32,auVar40,auVar41);
              *pauVar11 = auVar32;
              pauVar11[1] = auVar33;
              uVar18 = auVar38._0_8_;
              pauVar11 = pauVar11 + 2;
            }
            else {
              lVar12 = 0;
              for (; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                lVar12 = lVar12 + 1;
              }
              uVar15 = uVar15 - 1 & uVar15;
              uVar16 = (ulong)uVar15;
              auVar41._8_8_ = 0;
              auVar41._0_8_ = *(ulong *)(uVar24 + lVar12 * 8);
              auVar41 = vpunpcklqdq_avx(auVar41,ZEXT416(*(uint *)(local_2600 + lVar12 * 4)));
              if (uVar15 == 0) {
                auVar48 = vpshufd_avx(auVar40,0xaa);
                auVar40 = vblendvps_avx(auVar38,auVar32,auVar48);
                auVar32 = vblendvps_avx(auVar32,auVar38,auVar48);
                auVar38 = vpcmpgtd_avx(auVar41,auVar33);
                auVar48 = vpshufd_avx(auVar38,0xaa);
                auVar38 = vblendvps_avx(auVar41,auVar33,auVar48);
                auVar33 = vblendvps_avx(auVar33,auVar41,auVar48);
                auVar41 = vpcmpgtd_avx(auVar33,auVar32);
                auVar48 = vpshufd_avx(auVar41,0xaa);
                auVar41 = vblendvps_avx(auVar33,auVar32,auVar48);
                auVar32 = vblendvps_avx(auVar32,auVar33,auVar48);
                auVar33 = vpcmpgtd_avx(auVar38,auVar40);
                auVar48 = vpshufd_avx(auVar33,0xaa);
                auVar33 = vblendvps_avx(auVar38,auVar40,auVar48);
                auVar38 = vblendvps_avx(auVar40,auVar38,auVar48);
                auVar40 = vpcmpgtd_avx(auVar41,auVar38);
                auVar48 = vpshufd_avx(auVar40,0xaa);
                auVar40 = vblendvps_avx(auVar41,auVar38,auVar48);
                auVar38 = vblendvps_avx(auVar38,auVar41,auVar48);
                *pauVar11 = auVar32;
                pauVar11[1] = auVar38;
                pauVar11[2] = auVar40;
                uVar18 = auVar33._0_8_;
                pauVar26 = pauVar11 + 3;
              }
              else {
                *pauVar11 = auVar32;
                pauVar11[1] = auVar38;
                pauVar11[2] = auVar33;
                pauVar11[3] = auVar41;
                lVar12 = 0x30;
                do {
                  lVar19 = lVar12;
                  lVar12 = 0;
                  for (uVar18 = uVar16; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000
                      ) {
                    lVar12 = lVar12 + 1;
                  }
                  uVar18 = *(ulong *)(uVar24 + lVar12 * 8);
                  auVar33._8_8_ = 0;
                  auVar33._0_8_ = uVar18;
                  auVar32 = vpunpcklqdq_avx(auVar33,ZEXT416(*(uint *)(local_2600 + lVar12 * 4)));
                  *(undefined1 (*) [16])(pauVar11[1] + lVar19) = auVar32;
                  uVar16 = uVar16 - 1 & uVar16;
                  lVar12 = lVar19 + 0x10;
                } while (uVar16 != 0);
                pauVar26 = (undefined1 (*) [16])(pauVar11[1] + lVar19);
                if (lVar19 + 0x10 != 0) {
                  lVar12 = 0x10;
                  pauVar17 = pauVar11;
                  do {
                    auVar32 = pauVar17[1];
                    pauVar17 = pauVar17 + 1;
                    uVar15 = vextractps_avx(auVar32,2);
                    lVar19 = lVar12;
                    do {
                      if (uVar15 <= *(uint *)(pauVar11[-1] + lVar19 + 8)) {
                        pauVar20 = (undefined1 (*) [16])(*pauVar11 + lVar19);
                        break;
                      }
                      *(undefined1 (*) [16])(*pauVar11 + lVar19) =
                           *(undefined1 (*) [16])(pauVar11[-1] + lVar19);
                      lVar19 = lVar19 + -0x10;
                      pauVar20 = pauVar11;
                    } while (lVar19 != 0);
                    *pauVar20 = auVar32;
                    lVar12 = lVar12 + 0x10;
                  } while (pauVar26 != pauVar17);
                  uVar18 = *(ulong *)*pauVar26;
                }
              }
              auVar45 = ZEXT3264(auVar44);
              auVar50 = ZEXT3264(auVar49);
              auVar56 = ZEXT3264(auVar55);
              auVar60 = ZEXT3264(auVar59);
              auVar66 = ZEXT3264(auVar65);
              auVar69 = ZEXT3264(auVar69._0_32_);
              pauVar11 = pauVar26;
            }
          }
        }
      }
      local_2658 = (ulong)((uint)uVar18 & 0xf) - 8;
      if (local_2658 != 0) {
        uVar18 = uVar18 & 0xfffffffffffffff0;
        local_2668 = 0;
        do {
          lVar12 = local_2668 * 0x50;
          pSVar21 = context->scene;
          ppfVar2 = (pSVar21->vertices).items;
          pfVar3 = ppfVar2[*(uint *)(uVar18 + 0x30 + lVar12)];
          pfVar4 = ppfVar2[*(uint *)(uVar18 + 0x34 + lVar12)];
          pfVar5 = ppfVar2[*(uint *)(uVar18 + 0x38 + lVar12)];
          pfVar6 = ppfVar2[*(uint *)(uVar18 + 0x3c + lVar12)];
          auVar40 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar18 + lVar12)),
                                  *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar18 + 8 + lVar12)));
          auVar32 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar18 + lVar12)),
                                  *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar18 + 8 + lVar12)));
          auVar33 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar18 + 4 + lVar12)),
                                  *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar18 + 0xc + lVar12)))
          ;
          auVar38 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar18 + 4 + lVar12)),
                                  *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar18 + 0xc + lVar12)))
          ;
          auVar35 = vunpcklps_avx(auVar32,auVar38);
          auVar39 = vunpcklps_avx(auVar40,auVar33);
          auVar43 = vunpckhps_avx(auVar40,auVar33);
          auVar40 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar18 + 0x10 + lVar12))
                                  ,*(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar18 + 0x18 + lVar12)));
          auVar32 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar18 + 0x10 + lVar12))
                                  ,*(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar18 + 0x18 + lVar12)));
          auVar33 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar18 + 0x14 + lVar12))
                                  ,*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar18 + 0x1c + lVar12)));
          auVar38 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar18 + 0x14 + lVar12))
                                  ,*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar18 + 0x1c + lVar12)));
          auVar48 = vunpcklps_avx(auVar32,auVar38);
          auVar28 = vunpcklps_avx(auVar40,auVar33);
          auVar32 = vunpckhps_avx(auVar40,auVar33);
          auVar33 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar18 + 0x20 + lVar12))
                                  ,*(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar18 + 0x28 + lVar12)));
          auVar38 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar18 + 0x20 + lVar12))
                                  ,*(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar18 + 0x28 + lVar12)));
          auVar41 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar18 + 0x24 + lVar12))
                                  ,*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar18 + 0x2c + lVar12)));
          auVar40 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar18 + 0x24 + lVar12))
                                  ,*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar18 + 0x2c + lVar12)));
          auVar34 = vunpcklps_avx(auVar38,auVar40);
          auVar47 = vunpcklps_avx(auVar33,auVar41);
          auVar41 = vunpckhps_avx(auVar33,auVar41);
          puVar1 = (undefined8 *)(uVar18 + 0x30 + lVar12);
          local_2520 = *puVar1;
          uStack_2518 = puVar1[1];
          puVar1 = (undefined8 *)(uVar18 + 0x40 + lVar12);
          local_2610 = *puVar1;
          uStack_2608 = puVar1[1];
          auVar38 = vsubps_avx(auVar39,auVar28);
          auVar32 = vsubps_avx(auVar43,auVar32);
          auVar40 = vsubps_avx(auVar35,auVar48);
          auVar33 = vsubps_avx(auVar47,auVar39);
          auVar41 = vsubps_avx(auVar41,auVar43);
          auVar48 = vsubps_avx(auVar34,auVar35);
          auVar28._0_4_ = auVar48._0_4_ * auVar32._0_4_;
          auVar28._4_4_ = auVar48._4_4_ * auVar32._4_4_;
          auVar28._8_4_ = auVar48._8_4_ * auVar32._8_4_;
          auVar28._12_4_ = auVar48._12_4_ * auVar32._12_4_;
          local_2570 = vfmsub231ps_fma(auVar28,auVar41,auVar40);
          auVar34._0_4_ = auVar40._0_4_ * auVar33._0_4_;
          auVar34._4_4_ = auVar40._4_4_ * auVar33._4_4_;
          auVar34._8_4_ = auVar40._8_4_ * auVar33._8_4_;
          auVar34._12_4_ = auVar40._12_4_ * auVar33._12_4_;
          local_2560 = vfmsub231ps_fma(auVar34,auVar48,auVar38);
          uVar10 = *(undefined4 *)(ray + k * 4);
          auVar70._4_4_ = uVar10;
          auVar70._0_4_ = uVar10;
          auVar70._8_4_ = uVar10;
          auVar70._12_4_ = uVar10;
          uVar10 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar72._4_4_ = uVar10;
          auVar72._0_4_ = uVar10;
          auVar72._8_4_ = uVar10;
          auVar72._12_4_ = uVar10;
          uVar10 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar75._4_4_ = uVar10;
          auVar75._0_4_ = uVar10;
          auVar75._8_4_ = uVar10;
          auVar75._12_4_ = uVar10;
          fVar46 = *(float *)(ray + k * 4 + 0x40);
          auVar64._4_4_ = fVar46;
          auVar64._0_4_ = fVar46;
          auVar64._8_4_ = fVar46;
          auVar64._12_4_ = fVar46;
          auVar39 = vsubps_avx(auVar39,auVar70);
          fVar51 = *(float *)(ray + k * 4 + 0x50);
          auVar71._4_4_ = fVar51;
          auVar71._0_4_ = fVar51;
          auVar71._8_4_ = fVar51;
          auVar71._12_4_ = fVar51;
          auVar43 = vsubps_avx(auVar43,auVar72);
          fVar52 = *(float *)(ray + k * 4 + 0x60);
          auVar73._4_4_ = fVar52;
          auVar73._0_4_ = fVar52;
          auVar73._8_4_ = fVar52;
          auVar73._12_4_ = fVar52;
          auVar35 = vsubps_avx(auVar35,auVar75);
          auVar76._0_4_ = fVar46 * auVar43._0_4_;
          auVar76._4_4_ = fVar46 * auVar43._4_4_;
          auVar76._8_4_ = fVar46 * auVar43._8_4_;
          auVar76._12_4_ = fVar46 * auVar43._12_4_;
          auVar28 = vfmsub231ps_fma(auVar76,auVar39,auVar71);
          auVar67._0_4_ = auVar48._0_4_ * auVar28._0_4_;
          auVar67._4_4_ = auVar48._4_4_ * auVar28._4_4_;
          auVar67._8_4_ = auVar48._8_4_ * auVar28._8_4_;
          auVar67._12_4_ = auVar48._12_4_ * auVar28._12_4_;
          auVar77._0_4_ = auVar40._0_4_ * auVar28._0_4_;
          auVar77._4_4_ = auVar40._4_4_ * auVar28._4_4_;
          auVar77._8_4_ = auVar40._8_4_ * auVar28._8_4_;
          auVar77._12_4_ = auVar40._12_4_ * auVar28._12_4_;
          auVar57._0_4_ = fVar52 * auVar39._0_4_;
          auVar57._4_4_ = fVar52 * auVar39._4_4_;
          auVar57._8_4_ = fVar52 * auVar39._8_4_;
          auVar57._12_4_ = fVar52 * auVar39._12_4_;
          auVar48 = vfmsub231ps_fma(auVar57,auVar35,auVar64);
          auVar40 = vfmadd231ps_fma(auVar67,auVar48,auVar41);
          auVar48 = vfmadd231ps_fma(auVar77,auVar32,auVar48);
          auVar54._0_4_ = auVar41._0_4_ * auVar38._0_4_;
          auVar54._4_4_ = auVar41._4_4_ * auVar38._4_4_;
          auVar54._8_4_ = auVar41._8_4_ * auVar38._8_4_;
          auVar54._12_4_ = auVar41._12_4_ * auVar38._12_4_;
          local_2550[0] = vfmsub231ps_fma(auVar54,auVar33,auVar32);
          auVar47._0_4_ = fVar51 * auVar35._0_4_;
          auVar47._4_4_ = fVar51 * auVar35._4_4_;
          auVar47._8_4_ = fVar51 * auVar35._8_4_;
          auVar47._12_4_ = fVar51 * auVar35._12_4_;
          auVar28 = vfmsub231ps_fma(auVar47,auVar43,auVar73);
          auVar74._0_4_ = local_2550[0]._0_4_ * fVar52;
          auVar74._4_4_ = local_2550[0]._4_4_ * fVar52;
          auVar74._8_4_ = local_2550[0]._8_4_ * fVar52;
          auVar74._12_4_ = local_2550[0]._12_4_ * fVar52;
          auVar32 = vfmadd231ps_fma(auVar74,local_2560,auVar71);
          auVar41 = vfmadd231ps_fma(auVar32,local_2570,auVar64);
          auVar58._8_4_ = 0x80000000;
          auVar58._0_8_ = 0x8000000080000000;
          auVar58._12_4_ = 0x80000000;
          auVar40 = vfmadd231ps_fma(auVar40,auVar28,auVar33);
          auVar32 = vandps_avx(auVar41,auVar58);
          uVar15 = auVar32._0_4_;
          local_2600._0_4_ = (float)(uVar15 ^ auVar40._0_4_);
          uVar61 = auVar32._4_4_;
          local_2600._4_4_ = (float)(uVar61 ^ auVar40._4_4_);
          uVar62 = auVar32._8_4_;
          local_2600._8_4_ = (float)(uVar62 ^ auVar40._8_4_);
          uVar63 = auVar32._12_4_;
          local_2600._12_4_ = (float)(uVar63 ^ auVar40._12_4_);
          auVar32 = vfmadd231ps_fma(auVar48,auVar38,auVar28);
          local_2600._16_4_ = (float)(uVar15 ^ auVar32._0_4_);
          local_2600._20_4_ = (float)(uVar61 ^ auVar32._4_4_);
          local_2600._24_4_ = (float)(uVar62 ^ auVar32._8_4_);
          local_2600._28_4_ = (float)(uVar63 ^ auVar32._12_4_);
          auVar40 = ZEXT816(0) << 0x20;
          auVar32 = vcmpps_avx(local_2600._0_16_,auVar40,5);
          auVar38 = vcmpps_avx(local_2600._16_16_,auVar40,5);
          auVar32 = vandps_avx(auVar38,auVar32);
          auVar48._8_4_ = 0x7fffffff;
          auVar48._0_8_ = 0x7fffffff7fffffff;
          auVar48._12_4_ = 0x7fffffff;
          local_25d0 = vandps_avx(auVar41,auVar48);
          auVar38 = vcmpps_avx(auVar41,auVar40,4);
          auVar32 = vandps_avx(auVar32,auVar38);
          auVar68._0_4_ = local_2600._0_4_ + local_2600._16_4_;
          auVar68._4_4_ = local_2600._4_4_ + local_2600._20_4_;
          auVar68._8_4_ = local_2600._8_4_ + local_2600._24_4_;
          auVar68._12_4_ = local_2600._12_4_ + local_2600._28_4_;
          auVar38 = vcmpps_avx(auVar68,local_25d0,2);
          auVar40 = auVar38 & auVar32;
          if ((((auVar40 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar40 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar40 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar40[0xf] < '\0') {
            auVar32 = vandps_avx(auVar32,auVar38);
            auVar42._0_4_ = local_2550[0]._0_4_ * auVar35._0_4_;
            auVar42._4_4_ = local_2550[0]._4_4_ * auVar35._4_4_;
            auVar42._8_4_ = local_2550[0]._8_4_ * auVar35._8_4_;
            auVar42._12_4_ = local_2550[0]._12_4_ * auVar35._12_4_;
            auVar38 = vfmadd213ps_fma(auVar43,local_2560,auVar42);
            auVar38 = vfmadd213ps_fma(auVar39,local_2570,auVar38);
            local_25e0._0_4_ = (float)(uVar15 ^ auVar38._0_4_);
            local_25e0._4_4_ = (float)(uVar61 ^ auVar38._4_4_);
            local_25e0._8_4_ = (float)(uVar62 ^ auVar38._8_4_);
            local_25e0._12_4_ = (float)(uVar63 ^ auVar38._12_4_);
            fVar46 = *(float *)(ray + k * 4 + 0x30);
            auVar39._0_4_ = local_25d0._0_4_ * fVar46;
            auVar39._4_4_ = local_25d0._4_4_ * fVar46;
            auVar39._8_4_ = local_25d0._8_4_ * fVar46;
            auVar39._12_4_ = local_25d0._12_4_ * fVar46;
            auVar38 = vcmpps_avx(auVar39,local_25e0,1);
            fVar46 = *(float *)(ray + k * 4 + 0x80);
            auVar45 = ZEXT1664(CONCAT412(fVar46,CONCAT48(fVar46,CONCAT44(fVar46,fVar46))));
            auVar43._0_4_ = fVar46 * local_25d0._0_4_;
            auVar43._4_4_ = fVar46 * local_25d0._4_4_;
            auVar43._8_4_ = fVar46 * local_25d0._8_4_;
            auVar43._12_4_ = fVar46 * local_25d0._12_4_;
            auVar40 = vcmpps_avx(local_25e0,auVar43,2);
            auVar38 = vandps_avx(auVar38,auVar40);
            auVar40 = auVar32 & auVar38;
            if ((((auVar40 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar40 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar40 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar40[0xf] < '\0') {
              local_26c0 = vandps_avx(auVar32,auVar38);
              local_25b0 = local_26c0;
              auVar32 = vrcpps_avx(local_25d0);
              auVar35._8_4_ = 0x3f800000;
              auVar35._0_8_ = 0x3f8000003f800000;
              auVar35._12_4_ = 0x3f800000;
              auVar38 = vfnmadd213ps_fma(local_25d0,auVar32,auVar35);
              auVar32 = vfmadd132ps_fma(auVar38,auVar32,auVar32);
              fVar46 = auVar32._0_4_;
              local_2580._0_4_ = fVar46 * local_25e0._0_4_;
              fVar51 = auVar32._4_4_;
              local_2580._4_4_ = fVar51 * local_25e0._4_4_;
              fVar52 = auVar32._8_4_;
              local_2580._8_4_ = fVar52 * local_25e0._8_4_;
              fVar53 = auVar32._12_4_;
              local_2580._12_4_ = fVar53 * local_25e0._12_4_;
              auVar50 = ZEXT1664(local_2580);
              local_25a0[0] = fVar46 * local_2600._0_4_;
              local_25a0[1] = fVar51 * local_2600._4_4_;
              local_25a0[2] = fVar52 * local_2600._8_4_;
              local_25a0[3] = fVar53 * local_2600._12_4_;
              auVar36._8_4_ = 0x7f800000;
              auVar36._0_8_ = 0x7f8000007f800000;
              auVar36._12_4_ = 0x7f800000;
              auVar32 = vblendvps_avx(auVar36,local_2580,local_26c0);
              local_2590[0] = fVar46 * local_2600._16_4_;
              local_2590[1] = fVar51 * local_2600._20_4_;
              local_2590[2] = fVar52 * local_2600._24_4_;
              local_2590[3] = fVar53 * local_2600._28_4_;
              auVar38 = vshufps_avx(auVar32,auVar32,0xb1);
              auVar38 = vminps_avx(auVar38,auVar32);
              auVar40 = vshufpd_avx(auVar38,auVar38,1);
              auVar38 = vminps_avx(auVar40,auVar38);
              auVar32 = vcmpps_avx(auVar32,auVar38,0);
              auVar40 = local_26c0 & auVar32;
              auVar38 = vpcmpeqd_avx(auVar38,auVar38);
              if ((((auVar40 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar40 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar40 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar40[0xf] < '\0') {
                auVar38 = auVar32;
              }
              auVar32 = vandps_avx(local_26c0,auVar38);
              uVar10 = vmovmskps_avx(auVar32);
              local_2670 = 0;
              for (uVar24 = CONCAT44((int)((ulong)lVar12 >> 0x20),uVar10); local_26a8 = pSVar21,
                  (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
                local_2670 = local_2670 + 1;
              }
              do {
                local_26a0 = auVar45._0_16_;
                uVar15 = *(uint *)((long)&local_2520 + local_2670 * 4);
                uVar24 = (ulong)uVar15;
                local_2678 = (pSVar21->geometries).items[uVar24].ptr;
                if ((local_2678->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  *(undefined4 *)(local_26c0 + local_2670 * 4) = 0;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (local_2678->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar46 = local_25a0[local_2670];
                    fVar51 = local_2590[local_2670];
                    *(undefined4 *)(ray + k * 4 + 0x80) =
                         *(undefined4 *)(local_2580 + local_2670 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xc0) =
                         *(undefined4 *)(local_2570 + local_2670 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xd0) =
                         *(undefined4 *)(local_2560 + local_2670 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xe0) =
                         *(undefined4 *)(local_2550[0] + local_2670 * 4);
                    *(float *)(ray + k * 4 + 0xf0) = fVar46;
                    *(float *)(ray + k * 4 + 0x100) = fVar51;
                    *(undefined4 *)(ray + k * 4 + 0x110) =
                         *(undefined4 *)((long)&local_2610 + local_2670 * 4);
                    *(uint *)(ray + k * 4 + 0x120) = uVar15;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    break;
                  }
                  local_2530 = auVar50._0_16_;
                  local_2480 = auVar78._0_32_;
                  fVar46 = local_25a0[local_2670];
                  local_24e0._4_4_ = fVar46;
                  local_24e0._0_4_ = fVar46;
                  local_24e0._8_4_ = fVar46;
                  local_24e0._12_4_ = fVar46;
                  local_24d0 = local_2590[local_2670];
                  local_24b0._4_4_ = uVar15;
                  local_24b0._0_4_ = uVar15;
                  local_24b0._8_4_ = uVar15;
                  local_24b0._12_4_ = uVar15;
                  uVar10 = *(undefined4 *)((long)&local_2610 + local_2670 * 4);
                  local_24c0._4_4_ = uVar10;
                  local_24c0._0_4_ = uVar10;
                  local_24c0._8_4_ = uVar10;
                  local_24c0._12_4_ = uVar10;
                  local_2510 = *(undefined4 *)(local_2570 + local_2670 * 4);
                  uVar10 = *(undefined4 *)(local_2560 + local_2670 * 4);
                  local_2500._4_4_ = uVar10;
                  local_2500._0_4_ = uVar10;
                  local_2500._8_4_ = uVar10;
                  local_2500._12_4_ = uVar10;
                  uVar10 = *(undefined4 *)(local_2550[0] + local_2670 * 4);
                  local_24f0._4_4_ = uVar10;
                  local_24f0._0_4_ = uVar10;
                  local_24f0._8_4_ = uVar10;
                  local_24f0._12_4_ = uVar10;
                  uStack_250c = local_2510;
                  uStack_2508 = local_2510;
                  uStack_2504 = local_2510;
                  fStack_24cc = local_24d0;
                  fStack_24c8 = local_24d0;
                  fStack_24c4 = local_24d0;
                  vpcmpeqd_avx2(ZEXT1632(local_24e0),ZEXT1632(local_24e0));
                  uStack_249c = context->user->instID[0];
                  local_24a0 = uStack_249c;
                  uStack_2498 = uStack_249c;
                  uStack_2494 = uStack_249c;
                  uStack_2490 = context->user->instPrimID[0];
                  uStack_248c = uStack_2490;
                  uStack_2488 = uStack_2490;
                  uStack_2484 = uStack_2490;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2580 + local_2670 * 4)
                  ;
                  local_2690 = *local_2660;
                  local_2640.valid = (int *)local_2690;
                  local_2640.geometryUserPtr = local_2678->userPtr;
                  local_2640.context = context->user;
                  local_2640.hit = (RTCHitN *)&local_2510;
                  local_2640.N = 4;
                  local_2640.ray = (RTCRayN *)ray;
                  if (local_2678->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*local_2678->intersectionFilterN)(&local_2640);
                  }
                  if (local_2690 == (undefined1  [16])0x0) {
                    auVar32 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                    auVar32 = auVar32 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var7 = context->args->filter;
                    if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((local_2678->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var7)(&local_2640);
                    }
                    auVar38 = vpcmpeqd_avx(local_2690,_DAT_01f7aa10);
                    auVar32 = auVar38 ^ _DAT_01f7ae20;
                    if (local_2690 != (undefined1  [16])0x0) {
                      auVar38 = auVar38 ^ _DAT_01f7ae20;
                      auVar40 = vmaskmovps_avx(auVar38,*(undefined1 (*) [16])local_2640.hit);
                      *(undefined1 (*) [16])(local_2640.ray + 0xc0) = auVar40;
                      auVar40 = vmaskmovps_avx(auVar38,*(undefined1 (*) [16])(local_2640.hit + 0x10)
                                              );
                      *(undefined1 (*) [16])(local_2640.ray + 0xd0) = auVar40;
                      auVar40 = vmaskmovps_avx(auVar38,*(undefined1 (*) [16])(local_2640.hit + 0x20)
                                              );
                      *(undefined1 (*) [16])(local_2640.ray + 0xe0) = auVar40;
                      auVar40 = vmaskmovps_avx(auVar38,*(undefined1 (*) [16])(local_2640.hit + 0x30)
                                              );
                      *(undefined1 (*) [16])(local_2640.ray + 0xf0) = auVar40;
                      auVar40 = vmaskmovps_avx(auVar38,*(undefined1 (*) [16])(local_2640.hit + 0x40)
                                              );
                      *(undefined1 (*) [16])(local_2640.ray + 0x100) = auVar40;
                      auVar40 = vmaskmovps_avx(auVar38,*(undefined1 (*) [16])(local_2640.hit + 0x50)
                                              );
                      *(undefined1 (*) [16])(local_2640.ray + 0x110) = auVar40;
                      auVar40 = vmaskmovps_avx(auVar38,*(undefined1 (*) [16])(local_2640.hit + 0x60)
                                              );
                      *(undefined1 (*) [16])(local_2640.ray + 0x120) = auVar40;
                      auVar40 = vmaskmovps_avx(auVar38,*(undefined1 (*) [16])(local_2640.hit + 0x70)
                                              );
                      *(undefined1 (*) [16])(local_2640.ray + 0x130) = auVar40;
                      auVar38 = vmaskmovps_avx(auVar38,*(undefined1 (*) [16])(local_2640.hit + 0x80)
                                              );
                      *(undefined1 (*) [16])(local_2640.ray + 0x140) = auVar38;
                    }
                  }
                  auVar29._8_8_ = 0x100000001;
                  auVar29._0_8_ = 0x100000001;
                  if ((auVar29 & auVar32) == (undefined1  [16])0x0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_26a0._0_4_;
                  }
                  else {
                    local_26a0 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                  }
                  *(undefined4 *)(local_26c0 + local_2670 * 4) = 0;
                  auVar45 = ZEXT1664(local_26a0);
                  uVar10 = local_26a0._0_4_;
                  auVar30._4_4_ = uVar10;
                  auVar30._0_4_ = uVar10;
                  auVar30._8_4_ = uVar10;
                  auVar30._12_4_ = uVar10;
                  auVar50 = ZEXT1664(local_2530);
                  auVar32 = vcmpps_avx(local_2530,auVar30,2);
                  local_26c0 = vandps_avx(auVar32,local_26c0);
                  auVar78 = ZEXT3264(local_2480);
                  uVar24 = local_2670;
                  pSVar21 = local_26a8;
                }
                if ((((local_26c0 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (local_26c0 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (local_26c0 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < local_26c0[0xf]) break;
                auVar37._8_4_ = 0x7f800000;
                auVar37._0_8_ = 0x7f8000007f800000;
                auVar37._12_4_ = 0x7f800000;
                auVar32 = vblendvps_avx(auVar37,auVar50._0_16_,local_26c0);
                auVar38 = vshufps_avx(auVar32,auVar32,0xb1);
                auVar38 = vminps_avx(auVar38,auVar32);
                auVar40 = vshufpd_avx(auVar38,auVar38,1);
                auVar38 = vminps_avx(auVar40,auVar38);
                auVar38 = vcmpps_avx(auVar32,auVar38,0);
                auVar40 = local_26c0 & auVar38;
                auVar32 = local_26c0;
                if ((((auVar40 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar40 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar40 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar40[0xf] < '\0') {
                  auVar32 = vandps_avx(auVar38,local_26c0);
                }
                uVar10 = vmovmskps_avx(auVar32);
                local_2670 = 0;
                for (uVar24 = CONCAT44((int)(uVar24 >> 0x20),uVar10); (uVar24 & 1) == 0;
                    uVar24 = uVar24 >> 1 | 0x8000000000000000) {
                  local_2670 = local_2670 + 1;
                }
              } while( true );
            }
          }
          local_2668 = local_2668 + 1;
        } while (local_2668 != local_2658);
      }
      uVar10 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar31 = ZEXT3264(CONCAT428(uVar10,CONCAT424(uVar10,CONCAT420(uVar10,CONCAT416(uVar10,
                                                  CONCAT412(uVar10,CONCAT48(uVar10,CONCAT44(uVar10,
                                                  uVar10))))))));
      auVar45 = ZEXT3264(local_23c0);
      auVar50 = ZEXT3264(local_23e0);
      auVar56 = ZEXT3264(local_2400);
      auVar60 = ZEXT3264(local_2420);
      auVar66 = ZEXT3264(local_2440);
      auVar69 = ZEXT3264(local_2460);
    }
    if (pauVar11 == (undefined1 (*) [16])&local_23a0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }